

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms
          (KdTreeAttributesDecoder *this,DecoderBuffer *in_buffer)

{
  byte bVar1;
  float dt;
  _func_int *p_Var2;
  pointer pfVar3;
  PointAttribute *pPVar4;
  pointer pIVar5;
  uint32_t uVar6;
  DecoderBuffer *pDVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer piVar12;
  undefined4 extraout_var_02;
  ulong uVar13;
  uint uVar14;
  int attribute_index_1;
  uint uVar15;
  int attribute_index;
  long lVar16;
  uint8_t compression_level;
  uint8_t method;
  uint8_t quantization_bits;
  vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
  *local_4a8;
  DecoderBuffer *local_4a0;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  atts;
  vector<float,_std::allocator<float>_> min_value;
  AttributeQuantizationTransform transform;
  
  local_4a0 = in_buffer;
  if (0x202 < in_buffer->bitstream_version_) {
    min_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    min_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    min_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_4a8 = &this->attribute_quantization_transforms_;
    for (uVar14 = 0;
        iVar9 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[6])(this), (int)uVar14 < iVar9;
        uVar14 = uVar14 + 1) {
      iVar9 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[5])(this,(ulong)uVar14);
      iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[7])(this);
      lVar16 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar10) + 8) + 0x10) +
                        (long)iVar9 * 8);
      if (*(int *)(lVar16 + 0x1c) == 9) {
        bVar1 = *(byte *)(lVar16 + 0x18);
        std::vector<float,_std::allocator<float>_>::resize(&min_value,(ulong)bVar1);
        pDVar7 = local_4a0;
        bVar8 = DecoderBuffer::Decode
                          (local_4a0,
                           min_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,(ulong)((uint)bVar1 * 4));
        if ((!bVar8) || (bVar8 = DecoderBuffer::Decode<float>(pDVar7,(float *)&atts), !bVar8))
        goto LAB_00137240;
        bVar8 = DecoderBuffer::Decode<unsigned_char>(local_4a0,&quantization_bits);
        if (!bVar8 || 0x1f < quantization_bits) goto LAB_00137240;
        transform.super_AttributeTransform._vptr_AttributeTransform =
             (_func_int **)&PTR__AttributeQuantizationTransform_0017dba8;
        transform.quantization_bits_ = -1;
        transform.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        transform._36_8_ = 0;
        transform.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        transform.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        transform.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        bVar8 = AttributeQuantizationTransform::SetParameters
                          (&transform,_quantization_bits & 0xff,
                           min_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,(uint)bVar1,
                           atts.
                           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
        if ((!bVar8) ||
           (bVar8 = AttributeTransform::TransferToAttribute
                              (&transform.super_AttributeTransform,
                               (PointAttribute *)
                               (this->quantized_portable_attributes_).
                               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(int)(((long)(this->attribute_quantization_transforms_).
                                             super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->attribute_quantization_transforms_).
                                            super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                                            ._M_impl.super__Vector_impl_data._M_start) / 0x30)]._M_t
                               .
                               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                               ._M_t), !bVar8)) {
          AttributeQuantizationTransform::~AttributeQuantizationTransform(&transform);
          goto LAB_00137240;
        }
        std::
        vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
        ::push_back(local_4a8,&transform);
        AttributeQuantizationTransform::~AttributeQuantizationTransform(&transform);
      }
    }
    piVar12 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar13 = 0;
        uVar13 < (ulong)((long)(this->min_signed_values_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar12 >> 2);
        uVar13 = uVar13 + 1) {
      bVar8 = DecodeVarint<int>((int *)&transform,local_4a0);
      if (!bVar8) goto LAB_00137240;
      piVar12 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar12[uVar13] = (uint)transform.super_AttributeTransform._vptr_AttributeTransform;
    }
    bVar8 = true;
    goto LAB_00137242;
  }
  uVar14 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[6])(this);
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector(&atts,(ulong)uVar14,(allocator_type *)&transform);
  lVar16 = 0;
  local_4a8._0_4_ = 0;
  for (uVar13 = 0;
      p_Var2 = (this->super_AttributesDecoder).super_AttributesDecoderInterface.
               _vptr_AttributesDecoderInterface[5], uVar14 != uVar13; uVar13 = uVar13 + 1) {
    iVar9 = (*p_Var2)(this,uVar13 & 0xffffffff);
    iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
               _vptr_AttributesDecoderInterface[7])(this);
    pfVar3 = *(pointer *)
              (*(long *)(*(long *)(CONCAT44(extraout_var_00,iVar10) + 8) + 0x10) + (long)iVar9 * 8);
    dt = pfVar3[7];
    iVar11 = DataTypeLength((DataType)dt);
    uVar6 = (uint32_t)local_4a8;
    if (4 < iVar11) goto LAB_001374d0;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    bVar1 = *(byte *)(pfVar3 + 6);
    transform.super_AttributeTransform._vptr_AttributeTransform._4_4_ = iVar11;
    transform.super_AttributeTransform._vptr_AttributeTransform._0_4_ = (uint)bVar1;
    transform._12_4_ = (uint32_t)local_4a8;
    transform.quantization_bits_ = (int32_t)dt;
    transform.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = pfVar3;
    std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>::
    operator=((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               *)(CONCAT44(atts.
                           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           atts.
                           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar16),
              (type)&transform);
    local_4a8._0_4_ = uVar6 + bVar1;
    lVar16 = lVar16 + 0x18;
  }
  iVar9 = (*p_Var2)(this,0);
  iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[7])(this);
  pPVar4 = *(PointAttribute **)
            (*(long *)(*(long *)(CONCAT44(extraout_var_01,iVar10) + 8) + 0x10) + (long)iVar9 * 8);
  pPVar4->identity_mapping_ = true;
  pIVar5 = (pPVar4->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar4->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar5) {
    (pPVar4->indices_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar5;
  }
  bVar8 = DecoderBuffer::Decode<unsigned_char>(local_4a0,&method);
  pDVar7 = local_4a0;
  if (!bVar8) goto LAB_001374d0;
  if (method == '\x01') {
    compression_level = '\0';
    bVar8 = DecoderBuffer::Decode<unsigned_char>(local_4a0,&compression_level);
    if (!bVar8) goto LAB_001374d0;
    if (6 < compression_level) {
      printf("KdTreeAttributesDecoder: compression level %i not supported.\n");
      goto LAB_001374d0;
    }
    bVar8 = DecoderBuffer::Decode<unsigned_int>(local_4a0,(uint *)&quantization_bits);
    if (!bVar8) goto LAB_001374d0;
    for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      iVar9 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[5])(this,(ulong)uVar15);
      iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[7])(this);
      pPVar4 = *(PointAttribute **)
                (*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar10) + 8) + 0x10) + (long)iVar9 * 8
                );
      PointAttribute::Reset(pPVar4,(ulong)_quantization_bits);
      pPVar4->identity_mapping_ = true;
      pIVar5 = (pPVar4->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pPVar4->indices_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pIVar5) {
        (pPVar4->indices_map_).vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar5;
      }
    }
    PointAttributeVectorOutputIterator<unsigned_int>::PointAttributeVectorOutputIterator
              ((PointAttributeVectorOutputIterator<unsigned_int> *)&min_value,&atts);
    pDVar7 = local_4a0;
    switch(compression_level) {
    case '\0':
      DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<0> *)&transform,(uint32_t)local_4a8);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<0>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<0> *)&transform,pDVar7,
                         (PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<0> *)&transform);
      break;
    case '\x01':
      DynamicIntegerPointsKdTreeDecoder<1>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<1> *)&transform,(uint32_t)local_4a8);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<1>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<1> *)&transform,pDVar7,
                         (PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      DynamicIntegerPointsKdTreeDecoder<1>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<1> *)&transform);
      break;
    case '\x02':
      DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<2> *)&transform,(uint32_t)local_4a8);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<2>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<2> *)&transform,pDVar7,
                         (PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<2> *)&transform);
      break;
    case '\x03':
      DynamicIntegerPointsKdTreeDecoder<3>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<3> *)&transform,(uint32_t)local_4a8);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<3>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<3> *)&transform,pDVar7,
                         (PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      DynamicIntegerPointsKdTreeDecoder<3>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<3> *)&transform);
      break;
    case '\x04':
      DynamicIntegerPointsKdTreeDecoder<4>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<4> *)&transform,(uint32_t)local_4a8);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<4>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<4> *)&transform,pDVar7,
                         (PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      DynamicIntegerPointsKdTreeDecoder<4>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<4> *)&transform);
      break;
    case '\x05':
      DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<5> *)&transform,(uint32_t)local_4a8);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<5>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<5> *)&transform,pDVar7,
                         (PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<5> *)&transform);
      break;
    case '\x06':
      DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<6> *)&transform,(uint32_t)local_4a8);
      bVar8 = DynamicIntegerPointsKdTreeDecoder<6>::
              DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                        ((DynamicIntegerPointsKdTreeDecoder<6> *)&transform,pDVar7,
                         (PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<6> *)&transform);
      break;
    default:
      goto switchD_00137327_default;
    }
    if (bVar8 != false) {
      PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
                ((PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
      goto LAB_001374c2;
    }
switchD_00137327_default:
    PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
              ((PointAttributeVectorOutputIterator<unsigned_int> *)&min_value);
  }
  else if (((method == '\0') &&
           ((long)atts.
                  super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)CONCAT44(atts.
                           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           atts.
                           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) == 0x18)) &&
          (*(int *)CONCAT44(atts.
                            super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            atts.
                            super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) == 3)) {
    compression_level = '\0';
    bVar8 = DecoderBuffer::Decode<unsigned_char>(local_4a0,&compression_level);
    if (!bVar8) goto LAB_001374d0;
    _quantization_bits = 0;
    bVar8 = DecoderBuffer::Decode<unsigned_int>(pDVar7,(uint *)&quantization_bits);
    if (!bVar8) goto LAB_001374d0;
    PointAttribute::Reset(pPVar4,(ulong)_quantization_bits);
    FloatPointsTreeDecoder::FloatPointsTreeDecoder((FloatPointsTreeDecoder *)&min_value);
    min_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CONCAT44(_quantization_bits,
                           min_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._0_4_);
    PointAttributeVectorOutputIterator<float>::PointAttributeVectorOutputIterator
              ((PointAttributeVectorOutputIterator<float> *)&transform,&atts);
    bVar8 = FloatPointsTreeDecoder::
            DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>
                      ((FloatPointsTreeDecoder *)&min_value,pDVar7,
                       (PointAttributeVectorOutputIterator<float> *)&transform);
    PointAttributeVectorOutputIterator<float>::~PointAttributeVectorOutputIterator
              ((PointAttributeVectorOutputIterator<float> *)&transform);
    if (!bVar8) goto LAB_001374d0;
LAB_001374c2:
    bVar8 = true;
    goto LAB_001374d2;
  }
LAB_001374d0:
  bVar8 = false;
LAB_001374d2:
  std::
  _Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&atts.
                   super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                 );
  return bVar8;
LAB_00137240:
  bVar8 = false;
LAB_00137242:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&min_value.super__Vector_base<float,_std::allocator<float>_>);
  return bVar8;
}

Assistant:

bool KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms(
    DecoderBuffer *in_buffer) {
  if (in_buffer->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 3)) {
    // Decode quantization data for each attribute that need it.
    // TODO(ostava): This should be moved to AttributeQuantizationTransform.
    std::vector<float> min_value;
    for (int i = 0; i < GetNumAttributes(); ++i) {
      const int att_id = GetAttributeId(i);
      const PointAttribute *const att =
          GetDecoder()->point_cloud()->attribute(att_id);
      if (att->data_type() == DT_FLOAT32) {
        const int num_components = att->num_components();
        min_value.resize(num_components);
        if (!in_buffer->Decode(&min_value[0], sizeof(float) * num_components)) {
          return false;
        }
        float max_value_dif;
        if (!in_buffer->Decode(&max_value_dif)) {
          return false;
        }
        uint8_t quantization_bits;
        if (!in_buffer->Decode(&quantization_bits) || quantization_bits > 31) {
          return false;
        }
        AttributeQuantizationTransform transform;
        if (!transform.SetParameters(quantization_bits, min_value.data(),
                                     num_components, max_value_dif)) {
          return false;
        }
        const int num_transforms =
            static_cast<int>(attribute_quantization_transforms_.size());
        if (!transform.TransferToAttribute(
                quantized_portable_attributes_[num_transforms].get())) {
          return false;
        }
        attribute_quantization_transforms_.push_back(transform);
      }
    }

    // Decode transform data for signed integer attributes.
    for (int i = 0; i < min_signed_values_.size(); ++i) {
      int32_t val;
      if (!DecodeVarint(&val, in_buffer)) {
        return false;
      }
      min_signed_values_[i] = val;
    }
    return true;
  }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  // Handle old bitstream
  // Figure out the total dimensionality of the point cloud
  const uint32_t attribute_count = GetNumAttributes();
  uint32_t total_dimensionality = 0;  // position is a required dimension
  std::vector<AttributeTuple> atts(attribute_count);
  for (auto attribute_index = 0;
       static_cast<uint32_t>(attribute_index) < attribute_count;
       attribute_index += 1)  // increment the dimensionality as needed...
  {
    const int att_id = GetAttributeId(attribute_index);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    const DataType data_type = att->data_type();
    const uint32_t data_size = (std::max)(0, DataTypeLength(data_type));
    const uint32_t num_components = att->num_components();
    if (data_size > 4) {
      return false;
    }

    atts[attribute_index] = std::make_tuple(
        att, total_dimensionality, data_type, data_size, num_components);
    // everything is treated as 32bit in the encoder.
    total_dimensionality += num_components;
  }

  const int att_id = GetAttributeId(0);
  PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
  att->SetIdentityMapping();
  // Decode method
  uint8_t method;
  if (!in_buffer->Decode(&method)) {
    return false;
  }
  if (method == KdTreeAttributesEncodingMethod::kKdTreeQuantizationEncoding) {
    // This method only supports one attribute with exactly three components.
    if (atts.size() != 1 || std::get<4>(atts[0]) != 3) {
      return false;
    }
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    uint32_t num_points = 0;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }
    att->Reset(num_points);
    FloatPointsTreeDecoder decoder;
    decoder.set_num_points_from_header(num_points);
    PointAttributeVectorOutputIterator<float> out_it(atts);
    if (!decoder.DecodePointCloud(in_buffer, out_it)) {
      return false;
    }
  } else if (method == KdTreeAttributesEncodingMethod::kKdTreeIntegerEncoding) {
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    if (6 < compression_level) {
      DRACO_LOGE(
          "KdTreeAttributesDecoder: compression level %i not supported.\n",
          compression_level);
      return false;
    }

    uint32_t num_points;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }

    for (auto attribute_index = 0;
         static_cast<uint32_t>(attribute_index) < attribute_count;
         attribute_index += 1) {
      const int att_id = GetAttributeId(attribute_index);
      PointAttribute *const attr =
          GetDecoder()->point_cloud()->attribute(att_id);
      attr->Reset(num_points);
      attr->SetIdentityMapping();
    }

    PointAttributeVectorOutputIterator<uint32_t> out_it(atts);

    switch (compression_level) {
      case 0: {
        DynamicIntegerPointsKdTreeDecoder<0> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 1: {
        DynamicIntegerPointsKdTreeDecoder<1> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 2: {
        DynamicIntegerPointsKdTreeDecoder<2> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 3: {
        DynamicIntegerPointsKdTreeDecoder<3> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 4: {
        DynamicIntegerPointsKdTreeDecoder<4> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 5: {
        DynamicIntegerPointsKdTreeDecoder<5> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 6: {
        DynamicIntegerPointsKdTreeDecoder<6> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      default:
        return false;
    }
  } else {
    // Invalid method.
    return false;
  }
  return true;
#else
  return false;
#endif
}